

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usd-export.cc
# Opt level: O3

bool tinyusdz::tydra::detail::FlattenSkelNode
               (SkelNode *node,vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *joints,
               vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *jointNames,
               vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
               *bindTransforms,
               vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
               *restTransforms,string *err)

{
  SkelNode *pSVar1;
  bool bVar2;
  long lVar3;
  SkelNode *child;
  ulong uVar4;
  SkelNode *node_00;
  matrix4d *pmVar5;
  pointer pmVar6;
  byte bVar7;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  ulong local_38;
  
  bVar7 = 0;
  uVar4 = (ulong)node->joint_id;
  if (uVar4 < (ulong)((long)(joints->
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(joints->
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 5)) {
    local_58 = &local_48;
    local_50 = 0;
    local_48 = 0;
    ::std::__cxx11::string::_M_assign((string *)&local_58);
    local_38 = uVar4;
    ::std::__cxx11::string::operator=
              ((string *)
               ((joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                _M_impl.super__Vector_impl_data._M_start + uVar4),(string *)&local_58);
    if (local_58 != &local_48) {
      operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
    }
    local_58 = &local_48;
    local_50 = 0;
    local_48 = 0;
    ::std::__cxx11::string::_M_assign((string *)&local_58);
    ::std::__cxx11::string::operator=
              ((string *)
               ((jointNames->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                _M_impl.super__Vector_impl_data._M_start + uVar4),(string *)&local_58);
    if (local_58 != &local_48) {
      operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
    }
    pmVar5 = &node->bind_transform;
    pmVar6 = (bindTransforms->
             super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
             )._M_impl.super__Vector_impl_data._M_start + local_38;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      pmVar6->m[0][0] = pmVar5->m[0][0];
      pmVar5 = (matrix4d *)((long)pmVar5 + (ulong)bVar7 * -0x10 + 8);
      pmVar6 = (pointer)((long)pmVar6 + ((ulong)bVar7 * -2 + 1) * 8);
    }
    pmVar5 = &node->rest_transform;
    pmVar6 = (restTransforms->
             super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
             )._M_impl.super__Vector_impl_data._M_start + local_38;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      pmVar6->m[0][0] = pmVar5->m[0][0];
      pmVar5 = (matrix4d *)((long)pmVar5 + (ulong)bVar7 * -0x10 + 8);
      pmVar6 = (pointer)((long)pmVar6 + ((ulong)bVar7 * -2 + 1) * 8);
    }
    node_00 = (node->children).
              super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar1 = (node->children).
             super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (node_00 == pSVar1) {
      bVar2 = true;
    }
    else {
      do {
        bVar2 = FlattenSkelNode(node_00,joints,jointNames,bindTransforms,restTransforms,err);
        if (!bVar2) {
          return bVar2;
        }
        node_00 = node_00 + 1;
      } while (node_00 != pSVar1);
    }
  }
  else {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool FlattenSkelNode(const SkelNode &node,
  std::vector<value::token> &joints,
  std::vector<value::token> &jointNames,
  std::vector<value::matrix4d> &bindTransforms,
  std::vector<value::matrix4d> &restTransforms, std::string *err) {

  size_t idx = size_t(node.joint_id);
  if (idx >= joints.size()) {
    if (err) {
      (*err) += "joint_id out-of-bounds.";
    }
    return false;
  }

  joints[idx] = value::token(node.joint_path);
  jointNames[idx] = value::token(node.joint_name);
  bindTransforms[idx] = node.bind_transform;
  restTransforms[idx] = node.rest_transform;

  for (const auto &child : node.children) {
    if (!FlattenSkelNode(child, joints, jointNames, bindTransforms, restTransforms, err)) {
      return false;
    }
  }

  return true;
}